

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function.cpp
# Opt level: O2

string * __thiscall
duckdb::TableFunctionRef::ToString_abi_cxx11_(string *__return_storage_ptr__,TableFunctionRef *this)

{
  pointer pPVar1;
  string sStack_38;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->function);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&sStack_38,pPVar1);
  TableRef::BaseToString
            (__return_storage_ptr__,&this->super_TableRef,&sStack_38,
             &(this->super_TableRef).column_name_alias);
  ::std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

string TableFunctionRef::ToString() const {
	return BaseToString(function->ToString(), column_name_alias);
}